

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxcover.cpp
# Opt level: O2

size_t sets_union<512ul,std::array<unsigned_long,2ul>>
                 (vector<std::bitset<512UL>,_std::allocator<std::bitset<512UL>_>_> *binary_sets,
                 array<unsigned_long,_2UL> *c)

{
  pointer pbVar1;
  size_t sVar2;
  long lVar3;
  value_type x;
  _Base_bitset<8UL> local_68;
  
  pbVar1 = (binary_sets->
           super__Vector_base<std::bitset<512UL>,_std::allocator<std::bitset<512UL>_>_>)._M_impl.
           super__Vector_impl_data._M_start + c->_M_elems[0];
  local_68._M_w[0] = (pbVar1->super__Base_bitset<8UL>)._M_w[0];
  local_68._M_w[1] = (pbVar1->super__Base_bitset<8UL>)._M_w[1];
  local_68._M_w[2] = (pbVar1->super__Base_bitset<8UL>)._M_w[2];
  local_68._M_w[3] = (pbVar1->super__Base_bitset<8UL>)._M_w[3];
  local_68._M_w[4] = (pbVar1->super__Base_bitset<8UL>)._M_w[4];
  local_68._M_w[5] = (pbVar1->super__Base_bitset<8UL>)._M_w[5];
  local_68._M_w[6] = (pbVar1->super__Base_bitset<8UL>)._M_w[6];
  local_68._M_w[7] = (pbVar1->super__Base_bitset<8UL>)._M_w[7];
  for (lVar3 = 0; lVar3 != 1; lVar3 = lVar3 + 1) {
    std::_Base_bitset<8UL>::_M_do_or
              (&local_68,
               &(binary_sets->
                super__Vector_base<std::bitset<512UL>,_std::allocator<std::bitset<512UL>_>_>).
                _M_impl.super__Vector_impl_data._M_start[c->_M_elems[lVar3 + 1]].
                super__Base_bitset<8UL>);
  }
  sVar2 = std::_Base_bitset<8UL>::_M_do_count(&local_68);
  return sVar2;
}

Assistant:

size_t sets_union(const std::vector<std::bitset<n_entities>>& binary_sets, const Collection& c)
{
    auto x = binary_sets[c[0]];
    for (size_t i = 1; i < c.size(); ++i)
        x |= binary_sets[c[i]];
    return x.count();
}